

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_zstd.c
# Opt level: O2

int zstd_bidder_init(archive_read_filter *self)

{
  int iVar1;
  size_t __size;
  undefined8 *__ptr;
  void *__ptr_00;
  ZSTD_DStream *zds;
  
  __size = ZSTD_DStreamOutSize();
  self->code = 0xe;
  self->name = "zstd";
  __ptr = (undefined8 *)calloc(0x28,1);
  __ptr_00 = malloc(__size);
  zds = ZSTD_createDStream();
  if (zds == (ZSTD_DStream *)0x0 || (__ptr_00 == (void *)0x0 || __ptr == (undefined8 *)0x0)) {
    free(__ptr_00);
    free(__ptr);
    ZSTD_freeDStream(zds);
    archive_set_error(&self->archive->archive,0xc,"Can\'t allocate data for zstd decompression");
    iVar1 = -0x1e;
  }
  else {
    self->data = __ptr;
    __ptr[2] = __size;
    __ptr[1] = __ptr_00;
    *__ptr = zds;
    self->vtable = &zstd_reader_vtable;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
zstd_bidder_init(struct archive_read_filter *self)
{
	struct private_data *state;
	const size_t out_block_size = ZSTD_DStreamOutSize();
	void *out_block;
	ZSTD_DStream *dstream;

	self->code = ARCHIVE_FILTER_ZSTD;
	self->name = "zstd";

	state = (struct private_data *)calloc(sizeof(*state), 1);
	out_block = (unsigned char *)malloc(out_block_size);
	dstream = ZSTD_createDStream();

	if (state == NULL || out_block == NULL || dstream == NULL) {
		free(out_block);
		free(state);
		ZSTD_freeDStream(dstream); /* supports free on NULL */
		archive_set_error(&self->archive->archive, ENOMEM,
		    "Can't allocate data for zstd decompression");
		return (ARCHIVE_FATAL);
	}

	self->data = state;

	state->out_block_size = out_block_size;
	state->out_block = out_block;
	state->dstream = dstream;
	self->vtable = &zstd_reader_vtable;

	state->eof = 0;
	state->in_frame = 0;

	return (ARCHIVE_OK);
}